

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_extpubkey.cpp
# Opt level: O2

void __thiscall ExtPubkey_GetPubkeyAddress_Test::TestBody(ExtPubkey_GetPubkeyAddress_Test *this)

{
  char *pcVar1;
  AssertionResult gtest_ar_6;
  AssertHelper local_5b0;
  AssertionResult gtest_ar_14;
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> el_list;
  vector<cfd::core::Address,_std::allocator<cfd::core::Address>_> addrs3;
  vector<cfd::core::Address,_std::allocator<cfd::core::Address>_> addrs2;
  vector<cfd::core::Address,_std::allocator<cfd::core::Address>_> addrs1;
  Address addr3;
  Address addr2;
  string ext_base58;
  ExtPubkey pubkey;
  Address addr1;
  
  std::__cxx11::string::string
            ((string *)&ext_base58,
             "tpubDF7yNiHQHdfns9Mc3XM7PYcS2dqrPqcit3FLkebvHxS4atZxifANou2KTvpQQQP82ANDCkPc5MPQZ28pjYGgmDXGy1iyzaiX6MTBv8i4cua"
             ,(allocator *)&addr1);
  cfd::core::ExtPubkey::ExtPubkey(&pubkey,&ext_base58);
  cfd::core::Extkey::GetPubkeyAddress
            (&addr1,&pubkey.super_Extkey,kWitnessUnknown,
             (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             0x0,kCustomChain);
  cfd::core::Address::GetAddress_abi_cxx11_((string *)&addr2,&addr1);
  testing::internal::CmpHelperEQ<char[43],std::__cxx11::string>
            ((internal *)&addr3,"\"tb1qgrys9hdcsunfh5qklzj85e6qev9v5gmsyl4tfv\"",
             "addr1.GetAddress()",(char (*) [43])"tb1qgrys9hdcsunfh5qklzj85e6qev9v5gmsyl4tfv",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&addr2);
  std::__cxx11::string::~string((string *)&addr2);
  if ((undefined1)addr3.type_ == kCfdSuccess) {
    testing::Message::Message((Message *)&addr2);
    if (addr3._8_8_ == 0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)addr3._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_extpubkey.cpp"
               ,0xda,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6,(Message *)&addr2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&addr2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&addr3.witness_ver_);
  cfd::core::Extkey::GetPubkeyAddresses
            (&addrs1,&pubkey.super_Extkey,
             (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             0x0,kCustomChain);
  gtest_ar_6._0_4_ = 4;
  addr3._0_8_ = ((long)addrs1.
                       super__Vector_base<cfd::core::Address,_std::allocator<cfd::core::Address>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                (long)addrs1.
                      super__Vector_base<cfd::core::Address,_std::allocator<cfd::core::Address>_>.
                      _M_impl.super__Vector_impl_data._M_start) / 0x180;
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)&addr2,"4","addrs1.size()",(int *)&gtest_ar_6,(unsigned_long *)&addr3);
  if ((undefined1)addr2.type_ == kCfdSuccess) {
    testing::Message::Message((Message *)&addr3);
    if (addr2._8_8_ == 0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)addr2._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_extpubkey.cpp"
               ,0xdc,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6,(Message *)&addr3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&addr3);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&addr2.witness_ver_);
  if ((long)addrs1.super__Vector_base<cfd::core::Address,_std::allocator<cfd::core::Address>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)addrs1.super__Vector_base<cfd::core::Address,_std::allocator<cfd::core::Address>_>.
            _M_impl.super__Vector_impl_data._M_start == 0x600) {
    cfd::core::Address::GetAddress_abi_cxx11_
              ((string *)&addr2,
               addrs1.super__Vector_base<cfd::core::Address,_std::allocator<cfd::core::Address>_>.
               _M_impl.super__Vector_impl_data._M_start);
    testing::internal::CmpHelperEQ<char[43],std::__cxx11::string>
              ((internal *)&addr3,"\"tb1qgrys9hdcsunfh5qklzj85e6qev9v5gmsyl4tfv\"",
               "addrs1[0].GetAddress()",(char (*) [43])"tb1qgrys9hdcsunfh5qklzj85e6qev9v5gmsyl4tfv",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&addr2);
    std::__cxx11::string::~string((string *)&addr2);
    if ((undefined1)addr3.type_ == kCfdSuccess) {
      testing::Message::Message((Message *)&addr2);
      if (addr3._8_8_ == 0) {
        pcVar1 = "";
      }
      else {
        pcVar1 = *(char **)addr3._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_6,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_extpubkey.cpp"
                 ,0xdf,pcVar1);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6,(Message *)&addr2);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&addr2);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&addr3.witness_ver_);
    cfd::core::Address::GetAddress_abi_cxx11_
              ((string *)&addr2,
               addrs1.super__Vector_base<cfd::core::Address,_std::allocator<cfd::core::Address>_>.
               _M_impl.super__Vector_impl_data._M_start + 1);
    testing::internal::CmpHelperEQ<char[63],std::__cxx11::string>
              ((internal *)&addr3,
               "\"tb1p78nk0sz4tnspqke2wmg03vvmd5e6z3lc9a66qhzvp9vqcwtfflfs5wcm3n\"",
               "addrs1[1].GetAddress()",
               (char (*) [63])"tb1p78nk0sz4tnspqke2wmg03vvmd5e6z3lc9a66qhzvp9vqcwtfflfs5wcm3n",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&addr2);
    std::__cxx11::string::~string((string *)&addr2);
    if ((undefined1)addr3.type_ == kCfdSuccess) {
      testing::Message::Message((Message *)&addr2);
      if (addr3._8_8_ == 0) {
        pcVar1 = "";
      }
      else {
        pcVar1 = *(char **)addr3._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_6,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_extpubkey.cpp"
                 ,0xe1,pcVar1);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6,(Message *)&addr2);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&addr2);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&addr3.witness_ver_);
    cfd::core::Address::GetAddress_abi_cxx11_
              ((string *)&addr2,
               addrs1.super__Vector_base<cfd::core::Address,_std::allocator<cfd::core::Address>_>.
               _M_impl.super__Vector_impl_data._M_start + 2);
    testing::internal::CmpHelperEQ<char[36],std::__cxx11::string>
              ((internal *)&addr3,"\"2N9E4zD7TeFFuHTvzuVVvVSpmKq2DwGevP6\"","addrs1[2].GetAddress()"
               ,(char (*) [36])"2N9E4zD7TeFFuHTvzuVVvVSpmKq2DwGevP6",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&addr2);
    std::__cxx11::string::~string((string *)&addr2);
    if ((undefined1)addr3.type_ == kCfdSuccess) {
      testing::Message::Message((Message *)&addr2);
      if (addr3._8_8_ == 0) {
        pcVar1 = "";
      }
      else {
        pcVar1 = *(char **)addr3._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_6,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_extpubkey.cpp"
                 ,0xe3,pcVar1);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6,(Message *)&addr2);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&addr2);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&addr3.witness_ver_);
    cfd::core::Address::GetAddress_abi_cxx11_
              ((string *)&addr2,
               addrs1.super__Vector_base<cfd::core::Address,_std::allocator<cfd::core::Address>_>.
               _M_impl.super__Vector_impl_data._M_start + 3);
    testing::internal::CmpHelperEQ<char[35],std::__cxx11::string>
              ((internal *)&addr3,"\"mmRWLqKULV2s5o1j42FhB6ZhdscGmqSRH2\"","addrs1[3].GetAddress()",
               (char (*) [35])"mmRWLqKULV2s5o1j42FhB6ZhdscGmqSRH2",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&addr2);
    std::__cxx11::string::~string((string *)&addr2);
    if ((undefined1)addr3.type_ == kCfdSuccess) {
      testing::Message::Message((Message *)&addr2);
      if (addr3._8_8_ == 0) {
        pcVar1 = "";
      }
      else {
        pcVar1 = *(char **)addr3._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_6,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_extpubkey.cpp"
                 ,0xe5,pcVar1);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6,(Message *)&addr2);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&addr2);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&addr3.witness_ver_);
  }
  cfd::core::Extkey::GetPubkeyAddress
            (&addr2,&pubkey.super_Extkey,kWitnessUnknown,
             (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             0x0,kRegtest);
  cfd::core::Address::GetAddress_abi_cxx11_((string *)&addr3,&addr2);
  testing::internal::CmpHelperEQ<char[45],std::__cxx11::string>
            ((internal *)&gtest_ar_6,"\"bcrt1qgrys9hdcsunfh5qklzj85e6qev9v5gmsxkvx79\"",
             "addr2.GetAddress()",(char (*) [45])"bcrt1qgrys9hdcsunfh5qklzj85e6qev9v5gmsxkvx79",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&addr3);
  std::__cxx11::string::~string((string *)&addr3);
  if (gtest_ar_6.success_ == false) {
    testing::Message::Message((Message *)&addr3);
    if (gtest_ar_6.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar_6.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&addrs2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_extpubkey.cpp"
               ,0xeb,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&addrs2,(Message *)&addr3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&addrs2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&addr3);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_6.message_);
  cfd::core::Extkey::GetPubkeyAddresses
            (&addrs2,&pubkey.super_Extkey,
             (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             0x0,kRegtest);
  el_list.
  super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>.
  _M_impl.super__Vector_impl_data._M_start._0_4_ = 4;
  gtest_ar_6._0_8_ =
       ((long)addrs1.super__Vector_base<cfd::core::Address,_std::allocator<cfd::core::Address>_>.
              _M_impl.super__Vector_impl_data._M_finish -
       (long)addrs1.super__Vector_base<cfd::core::Address,_std::allocator<cfd::core::Address>_>.
             _M_impl.super__Vector_impl_data._M_start) / 0x180;
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)&addr3,"4","addrs1.size()",(int *)&el_list,(unsigned_long *)&gtest_ar_6);
  if ((undefined1)addr3.type_ == kCfdSuccess) {
    testing::Message::Message((Message *)&gtest_ar_6);
    if (addr3._8_8_ == 0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)addr3._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&el_list,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_extpubkey.cpp"
               ,0xed,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&el_list,(Message *)&gtest_ar_6);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&el_list);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_6);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&addr3.witness_ver_);
  if ((long)addrs2.super__Vector_base<cfd::core::Address,_std::allocator<cfd::core::Address>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)addrs2.super__Vector_base<cfd::core::Address,_std::allocator<cfd::core::Address>_>.
            _M_impl.super__Vector_impl_data._M_start == 0x600) {
    cfd::core::Address::GetAddress_abi_cxx11_
              ((string *)&addr3,
               addrs2.super__Vector_base<cfd::core::Address,_std::allocator<cfd::core::Address>_>.
               _M_impl.super__Vector_impl_data._M_start);
    testing::internal::CmpHelperEQ<char[45],std::__cxx11::string>
              ((internal *)&gtest_ar_6,"\"bcrt1qgrys9hdcsunfh5qklzj85e6qev9v5gmsxkvx79\"",
               "addrs2[0].GetAddress()",
               (char (*) [45])"bcrt1qgrys9hdcsunfh5qklzj85e6qev9v5gmsxkvx79",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&addr3);
    std::__cxx11::string::~string((string *)&addr3);
    if (gtest_ar_6.success_ == false) {
      testing::Message::Message((Message *)&addr3);
      if (gtest_ar_6.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar1 = "";
      }
      else {
        pcVar1 = ((gtest_ar_6.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&el_list,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_extpubkey.cpp"
                 ,0xf0,pcVar1);
      testing::internal::AssertHelper::operator=((AssertHelper *)&el_list,(Message *)&addr3);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&el_list);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&addr3);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_6.message_);
    cfd::core::Address::GetAddress_abi_cxx11_
              ((string *)&addr3,
               addrs2.super__Vector_base<cfd::core::Address,_std::allocator<cfd::core::Address>_>.
               _M_impl.super__Vector_impl_data._M_start + 1);
    testing::internal::CmpHelperEQ<char[65],std::__cxx11::string>
              ((internal *)&gtest_ar_6,
               "\"bcrt1p78nk0sz4tnspqke2wmg03vvmd5e6z3lc9a66qhzvp9vqcwtfflfsehjayf\"",
               "addrs2[1].GetAddress()",
               (char (*) [65])"bcrt1p78nk0sz4tnspqke2wmg03vvmd5e6z3lc9a66qhzvp9vqcwtfflfsehjayf",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&addr3);
    std::__cxx11::string::~string((string *)&addr3);
    if (gtest_ar_6.success_ == false) {
      testing::Message::Message((Message *)&addr3);
      if (gtest_ar_6.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar1 = "";
      }
      else {
        pcVar1 = ((gtest_ar_6.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&el_list,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_extpubkey.cpp"
                 ,0xf2,pcVar1);
      testing::internal::AssertHelper::operator=((AssertHelper *)&el_list,(Message *)&addr3);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&el_list);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&addr3);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_6.message_);
    cfd::core::Address::GetAddress_abi_cxx11_
              ((string *)&addr3,
               addrs2.super__Vector_base<cfd::core::Address,_std::allocator<cfd::core::Address>_>.
               _M_impl.super__Vector_impl_data._M_start + 2);
    testing::internal::CmpHelperEQ<char[36],std::__cxx11::string>
              ((internal *)&gtest_ar_6,"\"2N9E4zD7TeFFuHTvzuVVvVSpmKq2DwGevP6\"",
               "addrs2[2].GetAddress()",(char (*) [36])"2N9E4zD7TeFFuHTvzuVVvVSpmKq2DwGevP6",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&addr3);
    std::__cxx11::string::~string((string *)&addr3);
    if (gtest_ar_6.success_ == false) {
      testing::Message::Message((Message *)&addr3);
      if (gtest_ar_6.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar1 = "";
      }
      else {
        pcVar1 = ((gtest_ar_6.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&el_list,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_extpubkey.cpp"
                 ,0xf4,pcVar1);
      testing::internal::AssertHelper::operator=((AssertHelper *)&el_list,(Message *)&addr3);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&el_list);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&addr3);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_6.message_);
    cfd::core::Address::GetAddress_abi_cxx11_
              ((string *)&addr3,
               addrs2.super__Vector_base<cfd::core::Address,_std::allocator<cfd::core::Address>_>.
               _M_impl.super__Vector_impl_data._M_start + 3);
    testing::internal::CmpHelperEQ<char[35],std::__cxx11::string>
              ((internal *)&gtest_ar_6,"\"mmRWLqKULV2s5o1j42FhB6ZhdscGmqSRH2\"",
               "addrs2[3].GetAddress()",(char (*) [35])"mmRWLqKULV2s5o1j42FhB6ZhdscGmqSRH2",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&addr3);
    std::__cxx11::string::~string((string *)&addr3);
    if (gtest_ar_6.success_ == false) {
      testing::Message::Message((Message *)&addr3);
      if (gtest_ar_6.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar1 = "";
      }
      else {
        pcVar1 = ((gtest_ar_6.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&el_list,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_extpubkey.cpp"
                 ,0xf6,pcVar1);
      testing::internal::AssertHelper::operator=((AssertHelper *)&el_list,(Message *)&addr3);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&el_list);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&addr3);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_6.message_);
  }
  cfd::core::GetElementsAddressFormatList();
  cfd::core::Extkey::GetPubkeyAddress
            (&addr3,&pubkey.super_Extkey,kP2pkhAddress,&el_list,kElementsRegtest);
  cfd::core::Address::GetAddress_abi_cxx11_((string *)&gtest_ar_6,&addr3);
  testing::internal::CmpHelperEQ<char[36],std::__cxx11::string>
            ((internal *)&addrs3,"\"2dfLJSJHCNrVWVYJU63ZDJeKFgRZEuxc1JQ\"","addr3.GetAddress()",
             (char (*) [36])"2dfLJSJHCNrVWVYJU63ZDJeKFgRZEuxc1JQ",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_6);
  std::__cxx11::string::~string((string *)&gtest_ar_6);
  if ((char)addrs3.super__Vector_base<cfd::core::Address,_std::allocator<cfd::core::Address>_>.
            _M_impl.super__Vector_impl_data._M_start == '\0') {
    testing::Message::Message((Message *)&gtest_ar_6);
    if (addrs3.super__Vector_base<cfd::core::Address,_std::allocator<cfd::core::Address>_>._M_impl.
        super__Vector_impl_data._M_finish == (pointer)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)addrs3.
                         super__Vector_base<cfd::core::Address,_std::allocator<cfd::core::Address>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_14,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_extpubkey.cpp"
               ,0xfe,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_14,(Message *)&gtest_ar_6);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_14);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_6);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&addrs3.super__Vector_base<cfd::core::Address,_std::allocator<cfd::core::Address>_>
                  ._M_impl.super__Vector_impl_data._M_finish);
  cfd::core::Extkey::GetPubkeyAddresses(&addrs3,&pubkey.super_Extkey,&el_list,kElementsRegtest);
  local_5b0.data_._0_4_ = 4;
  gtest_ar_14._0_8_ =
       ((long)addrs3.super__Vector_base<cfd::core::Address,_std::allocator<cfd::core::Address>_>.
              _M_impl.super__Vector_impl_data._M_finish -
       CONCAT71(addrs3.super__Vector_base<cfd::core::Address,_std::allocator<cfd::core::Address>_>.
                _M_impl.super__Vector_impl_data._M_start._1_7_,
                (char)addrs3.
                      super__Vector_base<cfd::core::Address,_std::allocator<cfd::core::Address>_>.
                      _M_impl.super__Vector_impl_data._M_start)) / 0x180;
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)&gtest_ar_6,"4","addrs3.size()",(int *)&local_5b0,
             (unsigned_long *)&gtest_ar_14);
  if (gtest_ar_6.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_14);
    if (gtest_ar_6.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar_6.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_5b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_extpubkey.cpp"
               ,0x102,pcVar1);
    testing::internal::AssertHelper::operator=(&local_5b0,(Message *)&gtest_ar_14);
    testing::internal::AssertHelper::~AssertHelper(&local_5b0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_14);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_6.message_);
  if ((long)addrs3.super__Vector_base<cfd::core::Address,_std::allocator<cfd::core::Address>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)CONCAT71(addrs3.
                     super__Vector_base<cfd::core::Address,_std::allocator<cfd::core::Address>_>.
                     _M_impl.super__Vector_impl_data._M_start._1_7_,
                     (char)addrs3.
                           super__Vector_base<cfd::core::Address,_std::allocator<cfd::core::Address>_>
                           ._M_impl.super__Vector_impl_data._M_start) == 0x600) {
    cfd::core::Address::GetAddress_abi_cxx11_
              ((string *)&gtest_ar_6,
               (Address *)
               CONCAT71(addrs3.
                        super__Vector_base<cfd::core::Address,_std::allocator<cfd::core::Address>_>.
                        _M_impl.super__Vector_impl_data._M_start._1_7_,
                        (char)addrs3.
                              super__Vector_base<cfd::core::Address,_std::allocator<cfd::core::Address>_>
                              ._M_impl.super__Vector_impl_data._M_start));
    testing::internal::CmpHelperEQ<char[44],std::__cxx11::string>
              ((internal *)&gtest_ar_14,"\"ert1qgrys9hdcsunfh5qklzj85e6qev9v5gms7zecq9\"",
               "addrs3[0].GetAddress()",(char (*) [44])"ert1qgrys9hdcsunfh5qklzj85e6qev9v5gms7zecq9"
               ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_6);
    std::__cxx11::string::~string((string *)&gtest_ar_6);
    if (gtest_ar_14.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_6);
      if (gtest_ar_14.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar1 = "";
      }
      else {
        pcVar1 = ((gtest_ar_14.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_5b0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_extpubkey.cpp"
                 ,0x105,pcVar1);
      testing::internal::AssertHelper::operator=(&local_5b0,(Message *)&gtest_ar_6);
      testing::internal::AssertHelper::~AssertHelper(&local_5b0);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar_6);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_14.message_);
    cfd::core::Address::GetAddress_abi_cxx11_
              ((string *)&gtest_ar_6,
               (Address *)
               (CONCAT71(addrs3.
                         super__Vector_base<cfd::core::Address,_std::allocator<cfd::core::Address>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,
                         (char)addrs3.
                               super__Vector_base<cfd::core::Address,_std::allocator<cfd::core::Address>_>
                               ._M_impl.super__Vector_impl_data._M_start) + 0x180));
    testing::internal::CmpHelperEQ<char[64],std::__cxx11::string>
              ((internal *)&gtest_ar_14,
               "\"ert1p78nk0sz4tnspqke2wmg03vvmd5e6z3lc9a66qhzvp9vqcwtfflfsgy6rdd\"",
               "addrs3[1].GetAddress()",
               (char (*) [64])"ert1p78nk0sz4tnspqke2wmg03vvmd5e6z3lc9a66qhzvp9vqcwtfflfsgy6rdd",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_6);
    std::__cxx11::string::~string((string *)&gtest_ar_6);
    if (gtest_ar_14.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_6);
      if (gtest_ar_14.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar1 = "";
      }
      else {
        pcVar1 = ((gtest_ar_14.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_5b0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_extpubkey.cpp"
                 ,0x107,pcVar1);
      testing::internal::AssertHelper::operator=(&local_5b0,(Message *)&gtest_ar_6);
      testing::internal::AssertHelper::~AssertHelper(&local_5b0);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar_6);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_14.message_);
    cfd::core::Address::GetAddress_abi_cxx11_
              ((string *)&gtest_ar_6,
               (Address *)
               (CONCAT71(addrs3.
                         super__Vector_base<cfd::core::Address,_std::allocator<cfd::core::Address>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,
                         (char)addrs3.
                               super__Vector_base<cfd::core::Address,_std::allocator<cfd::core::Address>_>
                               ._M_impl.super__Vector_impl_data._M_start) + 0x300));
    testing::internal::CmpHelperEQ<char[35],std::__cxx11::string>
              ((internal *)&gtest_ar_14,"\"XTL5r53bjRBtL24WwjCMpGtaAnr5wmHkXL\"",
               "addrs3[2].GetAddress()",(char (*) [35])"XTL5r53bjRBtL24WwjCMpGtaAnr5wmHkXL",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_6);
    std::__cxx11::string::~string((string *)&gtest_ar_6);
    if (gtest_ar_14.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_6);
      if (gtest_ar_14.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar1 = "";
      }
      else {
        pcVar1 = ((gtest_ar_14.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_5b0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_extpubkey.cpp"
                 ,0x109,pcVar1);
      testing::internal::AssertHelper::operator=(&local_5b0,(Message *)&gtest_ar_6);
      testing::internal::AssertHelper::~AssertHelper(&local_5b0);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar_6);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_14.message_);
    cfd::core::Address::GetAddress_abi_cxx11_
              ((string *)&gtest_ar_6,
               (Address *)
               (CONCAT71(addrs3.
                         super__Vector_base<cfd::core::Address,_std::allocator<cfd::core::Address>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,
                         (char)addrs3.
                               super__Vector_base<cfd::core::Address,_std::allocator<cfd::core::Address>_>
                               ._M_impl.super__Vector_impl_data._M_start) + 0x480));
    testing::internal::CmpHelperEQ<char[36],std::__cxx11::string>
              ((internal *)&gtest_ar_14,"\"2dfLJSJHCNrVWVYJU63ZDJeKFgRZEuxc1JQ\"",
               "addrs3[3].GetAddress()",(char (*) [36])"2dfLJSJHCNrVWVYJU63ZDJeKFgRZEuxc1JQ",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_6);
    std::__cxx11::string::~string((string *)&gtest_ar_6);
    if (gtest_ar_14.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_6);
      if (gtest_ar_14.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar1 = "";
      }
      else {
        pcVar1 = ((gtest_ar_14.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_5b0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_extpubkey.cpp"
                 ,0x10b,pcVar1);
      testing::internal::AssertHelper::operator=(&local_5b0,(Message *)&gtest_ar_6);
      testing::internal::AssertHelper::~AssertHelper(&local_5b0);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar_6);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_14.message_);
  }
  std::vector<cfd::core::Address,_std::allocator<cfd::core::Address>_>::~vector(&addrs3);
  cfd::core::Address::~Address(&addr3);
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            (&el_list);
  std::vector<cfd::core::Address,_std::allocator<cfd::core::Address>_>::~vector(&addrs2);
  cfd::core::Address::~Address(&addr2);
  std::vector<cfd::core::Address,_std::allocator<cfd::core::Address>_>::~vector(&addrs1);
  cfd::core::Address::~Address(&addr1);
  cfd::core::Extkey::~Extkey(&pubkey.super_Extkey);
  std::__cxx11::string::~string((string *)&ext_base58);
  return;
}

Assistant:

TEST(ExtPubkey, GetPubkeyAddress) {
  std::string ext_base58 = "tpubDF7yNiHQHdfns9Mc3XM7PYcS2dqrPqcit3FLkebvHxS4atZxifANou2KTvpQQQP82ANDCkPc5MPQZ28pjYGgmDXGy1iyzaiX6MTBv8i4cua";

  ExtPubkey pubkey(ext_base58);
  auto addr1 = pubkey.GetPubkeyAddress();
  EXPECT_EQ("tb1qgrys9hdcsunfh5qklzj85e6qev9v5gmsyl4tfv",
    addr1.GetAddress());
  auto addrs1 = pubkey.GetPubkeyAddresses();
  EXPECT_EQ(4, addrs1.size());
  if (addrs1.size() == 4) {
    EXPECT_EQ("tb1qgrys9hdcsunfh5qklzj85e6qev9v5gmsyl4tfv",
      addrs1[0].GetAddress());
    EXPECT_EQ("tb1p78nk0sz4tnspqke2wmg03vvmd5e6z3lc9a66qhzvp9vqcwtfflfs5wcm3n",
      addrs1[1].GetAddress());
    EXPECT_EQ("2N9E4zD7TeFFuHTvzuVVvVSpmKq2DwGevP6",
      addrs1[2].GetAddress());
    EXPECT_EQ("mmRWLqKULV2s5o1j42FhB6ZhdscGmqSRH2",
      addrs1[3].GetAddress());
  }

  auto addr2 = pubkey.GetPubkeyAddress(
      AddressType::kWitnessUnknown, nullptr, NetType::kRegtest);
  EXPECT_EQ("bcrt1qgrys9hdcsunfh5qklzj85e6qev9v5gmsxkvx79",
    addr2.GetAddress());
  auto addrs2 = pubkey.GetPubkeyAddresses(nullptr, NetType::kRegtest);
  EXPECT_EQ(4, addrs1.size());
  if (addrs2.size() == 4) {
    EXPECT_EQ("bcrt1qgrys9hdcsunfh5qklzj85e6qev9v5gmsxkvx79",
      addrs2[0].GetAddress());
    EXPECT_EQ("bcrt1p78nk0sz4tnspqke2wmg03vvmd5e6z3lc9a66qhzvp9vqcwtfflfsehjayf",
      addrs2[1].GetAddress());
    EXPECT_EQ("2N9E4zD7TeFFuHTvzuVVvVSpmKq2DwGevP6",
      addrs2[2].GetAddress());
    EXPECT_EQ("mmRWLqKULV2s5o1j42FhB6ZhdscGmqSRH2",
      addrs2[3].GetAddress());
  }

#ifndef CFD_DISABLE_ELEMENTS
  auto el_list = cfd::core::GetElementsAddressFormatList();
  auto addr3 = pubkey.GetPubkeyAddress(AddressType::kP2pkhAddress,
      &el_list, NetType::kElementsRegtest);
  EXPECT_EQ("2dfLJSJHCNrVWVYJU63ZDJeKFgRZEuxc1JQ",
    addr3.GetAddress());

  auto addrs3 = pubkey.GetPubkeyAddresses(
      &el_list, NetType::kElementsRegtest);
  EXPECT_EQ(4, addrs3.size());
  if (addrs3.size() == 4) {
    EXPECT_EQ("ert1qgrys9hdcsunfh5qklzj85e6qev9v5gms7zecq9",
      addrs3[0].GetAddress());
    EXPECT_EQ("ert1p78nk0sz4tnspqke2wmg03vvmd5e6z3lc9a66qhzvp9vqcwtfflfsgy6rdd",
      addrs3[1].GetAddress());
    EXPECT_EQ("XTL5r53bjRBtL24WwjCMpGtaAnr5wmHkXL",
      addrs3[2].GetAddress());
    EXPECT_EQ("2dfLJSJHCNrVWVYJU63ZDJeKFgRZEuxc1JQ",
      addrs3[3].GetAddress());
  }
#endif  // CFD_DISABLE_ELEMENTS
}